

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathRunEval(xmlXPathParserContextPtr ctxt,int toBool)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlXPathObjectPtr *ppxVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlXPathObjectPtr local_38;
  xmlXPathObjectPtr resObj;
  xmlXPathCompExprPtr pxStack_28;
  int res;
  xmlXPathCompExprPtr comp;
  xmlXPathParserContextPtr pxStack_18;
  int toBool_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->comp == (xmlXPathCompExprPtr)0x0)) {
    return -1;
  }
  ctxt->context->depth = 0;
  comp._4_4_ = toBool;
  pxStack_18 = ctxt;
  if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
    ppxVar3 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    pxStack_18->valueTab = ppxVar3;
    if (pxStack_18->valueTab == (xmlXPathObjectPtr *)0x0) {
      xmlXPathPErrMemory(pxStack_18,"creating evaluation context\n");
      (*xmlFree)(pxStack_18);
    }
    pxStack_18->valueNr = 0;
    pxStack_18->valueMax = 10;
    pxStack_18->value = (xmlXPathObjectPtr)0x0;
    pxStack_18->valueFrame = 0;
  }
  if (pxStack_18->comp->stream != (xmlPatternPtr)0x0) {
    if (comp._4_4_ == 0) {
      local_38 = (xmlXPathObjectPtr)0x0;
      resObj._4_4_ = xmlXPathRunStreamEval(pxStack_18->context,pxStack_18->comp->stream,&local_38,0)
      ;
      if ((resObj._4_4_ != -1) && (local_38 != (xmlXPathObjectPtr)0x0)) {
        valuePush(pxStack_18,local_38);
        return 0;
      }
      if (local_38 != (xmlXPathObjectPtr)0x0) {
        xmlXPathReleaseObject(pxStack_18->context,local_38);
      }
    }
    else {
      iVar2 = xmlXPathRunStreamEval
                        (pxStack_18->context,pxStack_18->comp->stream,(xmlXPathObjectPtr *)0x0,1);
      if (iVar2 != -1) {
        return iVar2;
      }
      resObj._4_4_ = -1;
    }
  }
  pxStack_28 = pxStack_18->comp;
  if (pxStack_28->last < 0) {
    pp_Var4 = __xmlGenericError();
    p_Var1 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar5,"xmlXPathRunEval: last is less than zero\n");
    ctxt_local._4_4_ = -1;
  }
  else if (comp._4_4_ == 0) {
    xmlXPathCompOpEval(pxStack_18,pxStack_28->steps + pxStack_28->last);
    ctxt_local._4_4_ = 0;
  }
  else {
    ctxt_local._4_4_ =
         xmlXPathCompOpEvalToBoolean(pxStack_18,pxStack_28->steps + pxStack_28->last,0);
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathRunEval(xmlXPathParserContextPtr ctxt, int toBool)
{
    xmlXPathCompExprPtr comp;

    if ((ctxt == NULL) || (ctxt->comp == NULL))
	return(-1);

    ctxt->context->depth = 0;

    if (ctxt->valueTab == NULL) {
	/* Allocate the value stack */
	ctxt->valueTab = (xmlXPathObjectPtr *)
			 xmlMalloc(10 * sizeof(xmlXPathObjectPtr));
	if (ctxt->valueTab == NULL) {
	    xmlXPathPErrMemory(ctxt, "creating evaluation context\n");
	    xmlFree(ctxt);
	}
	ctxt->valueNr = 0;
	ctxt->valueMax = 10;
	ctxt->value = NULL;
        ctxt->valueFrame = 0;
    }
#ifdef XPATH_STREAMING
    if (ctxt->comp->stream) {
	int res;

	if (toBool) {
	    /*
	    * Evaluation to boolean result.
	    */
	    res = xmlXPathRunStreamEval(ctxt->context,
		ctxt->comp->stream, NULL, 1);
	    if (res != -1)
		return(res);
	} else {
	    xmlXPathObjectPtr resObj = NULL;

	    /*
	    * Evaluation to a sequence.
	    */
	    res = xmlXPathRunStreamEval(ctxt->context,
		ctxt->comp->stream, &resObj, 0);

	    if ((res != -1) && (resObj != NULL)) {
		valuePush(ctxt, resObj);
		return(0);
	    }
	    if (resObj != NULL)
		xmlXPathReleaseObject(ctxt->context, resObj);
	}
	/*
	* QUESTION TODO: This falls back to normal XPath evaluation
	* if res == -1. Is this intended?
	*/
    }
#endif
    comp = ctxt->comp;
    if (comp->last < 0) {
	xmlGenericError(xmlGenericErrorContext,
	    "xmlXPathRunEval: last is less than zero\n");
	return(-1);
    }
    if (toBool)
	return(xmlXPathCompOpEvalToBoolean(ctxt,
	    &comp->steps[comp->last], 0));
    else
	xmlXPathCompOpEval(ctxt, &comp->steps[comp->last]);

    return(0);
}